

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O2

uint __thiscall
skippable_text<unsigned_int,_unsigned_int>::prev_non_blank_position
          (skippable_text<unsigned_int,_unsigned_int> *this,uint i)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((i & 0x3f) != 0) &&
     (uVar3 = (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[i >> 6] >>
              ((ulong)(byte)-(char)(i & 0x3f) & 0x3f), uVar3 != 0)) {
    uVar1 = 0;
    for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
      uVar1 = uVar1 + 1;
    }
LAB_0010fa45:
    return ~uVar1 + i;
  }
  if (0x3f < i) {
    uVar2 = (ulong)((i >> 6) - 1);
    uVar3 = (this->non_blank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar2];
    if (uVar3 != 0) {
      uVar1 = 0;
      for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
        uVar1 = uVar1 + 1;
      }
      i = i & 0xffffffc0;
      goto LAB_0010fa45;
    }
    if ((uVar2 != 0) &&
       (uVar1 = (int)(this->skips).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2] + 1, uVar1 <= i)) {
      return i - uVar1;
    }
  }
  return this->null;
}

Assistant:

itype prev_non_blank_position(itype i){

		assert(i<T.size());
		assert(not is_blank(i));

		itype block = i/64;
		itype off = i%64;

		uint64_t prev_bits = off == 0 ? 0 : (non_blank[block] >> (64-off));

		if(prev_bits != 0){

			//case 1: there is a non-blank position before position i inside this block

			assert(i >= (ctz( prev_bits )+1));

			itype i_1 = i - (ctz( prev_bits )+1);

			assert(not is_blank(i_1));

			return i_1;

		}

		//case 2: there isn't a non-blank position before position i inside this block

		if(block == 0) return null; //this is the first block: i is the first non-blank position

		if(non_blank[block-1] != 0){

			//case 2.1: there is a non-blank position in the previous block

			itype tz = ctz( non_blank[block-1] );

			assert(tz<64);

			itype i_1 = block*64 - (tz+1);

			assert(not is_blank(i_1));

			return i_1;

		}

		//case 2.2: there isn't a non-blank position in the previous block

		if(block-1 == 0) return null; //previous block is the first block: i is the first non-blank position

		itype skip_len = skips[block-1];

		assert(i < (skip_len+1) || not is_blank(i - (skip_len+1)));

		return i >= (skip_len+1) ? i - (skip_len+1) : null;

	}